

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

string * __thiscall Node::dump_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  string sStack_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  dotName_abi_cxx11_(&local_88,this);
  std::operator+(&local_68,&local_88," ");
  label_abi_cxx11_(&sStack_a8,this);
  std::operator+(&local_48,&local_68,&sStack_a8);
  std::operator+(__return_storage_ptr__,&local_48,"\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

string Node::dump() const {
    return this->dotName() + " " + this->label() + "\n";
}